

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

pair<double,_double> __thiscall
HPresolve::getBoundsImpliedFree(HPresolve *this,double lowInit,double uppInit,int col,int i,int k)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<int,_std::allocator<int>_> *this_04;
  vector<double,_std::allocator<double>_> *this_05;
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  size_type sVar5;
  size_type sVar6;
  vector<double,_std::allocator<double>_> *this_06;
  bool bVar7;
  value_type vVar8;
  double dVar9;
  pair<double,_double> pVar10;
  double local_a0;
  double local_88;
  
  this_02 = &(this->super_HPreData).ARstart;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)i);
  this_03 = &(this->super_HPreData).ARindex;
  this_04 = &(this->super_HPreData).flagCol;
  this_00 = &(this->super_HPreData).colLower;
  this_05 = &(this->super_HPreData).colUpper;
  this_01 = &(this->super_HPreData).Avalue;
  __n = (size_type)k;
  this_06 = &(this->super_HPreData).ARvalue;
  local_a0 = lowInit;
  for (sVar5 = (size_type)*pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)(i + 1)),
      (long)sVar5 < (long)*pvVar2; sVar5 = sVar5 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar5);
    iVar1 = *pvVar2;
    sVar6 = (size_type)iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar6);
    if ((iVar1 != col) && (*pvVar2 != 0)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->implColLowerRowIndex,sVar6);
      iVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar6);
      if (iVar1 == i) {
        vVar8 = *pvVar3;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::at(&this->implColLower,sVar6);
        vVar8 = *pvVar4;
        if (*pvVar4 <= *pvVar3) {
          vVar8 = *pvVar3;
        }
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->implColUpperRowIndex,sVar6);
      iVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar6);
      if (iVar1 == i) {
        dVar9 = *pvVar3;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::at(&this->implColUpper,sVar6);
        dVar9 = *pvVar4;
        if (*pvVar3 <= *pvVar4) {
          dVar9 = *pvVar3;
        }
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
      if (((*pvVar3 <= 0.0 && *pvVar3 != 0.0) &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5), 0.0 < *pvVar3))
         || ((pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_01,__n), 0.0 < *pvVar3
             && (pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5),
                *pvVar3 <= 0.0 && *pvVar3 != 0.0)))) {
        bVar7 = vVar8 == -1e+200;
        dVar9 = vVar8;
      }
      else {
        bVar7 = dVar9 == 1e+200;
      }
      if ((bVar7) && (!NAN(dVar9))) {
        local_a0 = -1e+200;
        break;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5);
      local_a0 = local_a0 - dVar9 * *pvVar3;
    }
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)i);
  sVar5 = (size_type)*pvVar2;
  local_88 = uppInit;
  do {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)(i + 1));
    if ((long)*pvVar2 <= (long)sVar5) {
LAB_00142b48:
      pVar10.second = local_88;
      pVar10.first = local_a0;
      return pVar10;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar5);
    iVar1 = *pvVar2;
    sVar6 = (size_type)iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar6);
    if ((iVar1 != col) && (*pvVar2 != 0)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->implColLowerRowIndex,sVar6);
      iVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar6);
      if (iVar1 == i) {
        dVar9 = *pvVar3;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::at(&this->implColLower,sVar6);
        dVar9 = *pvVar4;
        if (*pvVar4 <= *pvVar3) {
          dVar9 = *pvVar3;
        }
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->implColUpperRowIndex,sVar6);
      iVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar6);
      if (iVar1 == i) {
        vVar8 = *pvVar3;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::at(&this->implColUpper,sVar6);
        vVar8 = *pvVar4;
        if (*pvVar3 <= *pvVar4) {
          vVar8 = *pvVar3;
        }
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
      if (((*pvVar3 <= 0.0 && *pvVar3 != 0.0) &&
          (pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5), 0.0 < *pvVar3))
         || ((pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_01,__n), 0.0 < *pvVar3
             && (pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5),
                *pvVar3 <= 0.0 && *pvVar3 != 0.0)))) {
        bVar7 = vVar8 == 1e+200;
        dVar9 = vVar8;
      }
      else {
        bVar7 = dVar9 == -1e+200;
      }
      if ((bVar7) && (!NAN(dVar9))) {
        local_88 = 1e+200;
        goto LAB_00142b48;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar5);
      local_88 = local_88 - dVar9 * *pvVar3;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

pair<double, double> HPresolve::getBoundsImpliedFree(double lowInit, double uppInit,
											const int col, const int i, const int k) {
	double low = lowInit;
	double upp = uppInit;

	//use implied bounds with original bounds
	int j;
	double l,u;
	// if at any stage low becomes  or upp becomes inf break loop  
	// can't use bounds for variables generated by the same row. 
	//low
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
		
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (l==-HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*l;
			else 
				if (u==HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*u;
		}
	}
	//upp
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
			// if at any stage low becomes  or upp becomes inf it's not implied free 
			//low:: 
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (u==HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*u;
			else 
				if (l==-HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*l;
		}
	}
	return make_pair(low, upp);
}